

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxSizeAlign::Resolve(FxSizeAlign *this,FCompileContext *ctx)

{
  PType *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  FxConstant *this_00;
  undefined4 extraout_var_00;
  char *pcVar4;
  char *message;
  FCompileContext *size;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar2 = (*this->Operand->_vptr_FxExpression[2])();
      pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
      this->Operand = pFVar3;
      if (pFVar3 != (FxExpression *)0x0) {
        pPVar1 = pFVar3->ValueType;
        iVar2 = (*pFVar3->_vptr_FxExpression[3])(pFVar3);
        if ((char)iVar2 == '\0') {
          size = ctx;
          iVar2 = (*this->Operand->_vptr_FxExpression[4])(this->Operand,ctx,0);
          if ((char)iVar2 != '\0') {
            this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
            FxConstant::FxConstant
                      (this_00,*(int *)(&(pPVar1->super_PTypeBase).super_DObject.field_0x24 +
                                       (ulong)(this->Which == 0x180) * 4),
                       &this->Operand->ScriptPosition);
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            iVar2 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
            return (FxExpression *)CONCAT44(extraout_var_00,iVar2);
          }
          pcVar4 = "size";
          if (this->Which == 0x180) {
            pcVar4 = "alignment";
          }
          message = "Operand must be addressable to determine %s";
        }
        else {
          pcVar4 = "size";
          if (this->Which == 0x180) {
            pcVar4 = "alignment";
          }
          message = "cannot determine %s of a constant";
        }
        FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar4);
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxSizeAlign *)0x0;
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxSizeAlign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	auto type = Operand->ValueType;
	if (Operand->isConstant())
	{
		ScriptPosition.Message(MSG_ERROR, "cannot determine %s of a constant", Which == TK_AlignOf? "alignment" : "size");
		delete this;
		return nullptr;
	}
	else if (!Operand->RequestAddress(ctx, nullptr))
	{
		ScriptPosition.Message(MSG_ERROR, "Operand must be addressable to determine %s", Which == TK_AlignOf ? "alignment" : "size");
		delete this;
		return nullptr;
	}
	else
	{
		FxExpression *x = new FxConstant(Which == TK_AlignOf ? int(type->Align) : int(type->Size), Operand->ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}
}